

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O2

HttpPost * __thiscall curlpp::HttpPost::operator=(HttpPost *this,Forms *posts)

{
  FormPart *pFVar1;
  _List_node_base *p_Var2;
  
  clear(this);
  p_Var2 = (_List_node_base *)posts;
  while (p_Var2 = (((_List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)posts) {
    std::__cxx11::
    list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
    ::push_back(&this->mForms,(value_type *)(p_Var2 + 1));
    pFVar1 = utilspp::clone_ptr<curlpp::FormPart>::operator->
                       ((clone_ptr<curlpp::FormPart> *)
                        ((this->mForms).
                         super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                         ._M_impl._M_node.super__List_node_base._M_prev + 1));
    (*pFVar1->_vptr_FormPart[3])(pFVar1,this,&this->mLast);
  }
  return this;
}

Assistant:

curlpp::HttpPost &
curlpp::HttpPost::operator=(const Forms & posts)
{
  clear();

  Forms::const_iterator pos;
  for(pos = posts.begin(); pos != posts.end(); pos++) 
  {
    mForms.push_back(*pos);
    mForms.back()->add(&mFirst, &mLast);
  } 

  return (*this);
}